

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O1

gotcha_error_t gotcha_set_priority(char *tool_name,int value)

{
  FILE *__stream;
  uint uVar1;
  uint uVar2;
  tool_t *ptVar3;
  
  gotcha_init();
  __stream = _stderr;
  if (0 < debug_level) {
    uVar1 = gotcha_gettid();
    uVar2 = getpid();
    fprintf(__stream,"[%d/%d][%s:%u] - User called gotcha_set_priority(%s, %d)\n",(ulong)uVar1,
            (ulong)uVar2,"gotcha.c",0x16c,tool_name,(ulong)(uint)value);
  }
  ptVar3 = get_tool(tool_name);
  if (ptVar3 == (tool_t *)0x0) {
    ptVar3 = create_tool(tool_name);
  }
  (ptVar3->config).priority = value;
  ptVar3 = get_tool(tool_name);
  if (ptVar3 == (tool_t *)0x0) {
    ptVar3 = create_tool(tool_name);
  }
  remove_tool_from_list(ptVar3);
  reorder_tool(ptVar3);
  return GOTCHA_SUCCESS;
}

Assistant:

gotcha_error_t gotcha_set_priority(const char* tool_name, int value){
  gotcha_init();
  debug_printf(1, "User called gotcha_set_priority(%s, %d)\n", tool_name, value);
  enum gotcha_error_t error_on_set = gotcha_configure_int(tool_name, GOTCHA_PRIORITY, value);
  if(error_on_set != GOTCHA_SUCCESS) {
    return error_on_set;
  }
  tool_t* tool_to_place = get_tool(tool_name);
  if(!tool_to_place){
     tool_to_place = create_tool(tool_name);
  }
  remove_tool_from_list(tool_to_place);
  reorder_tool(tool_to_place);
  return GOTCHA_SUCCESS;
}